

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalNinjaGenerator::OpenBuildFileStreams(cmGlobalNinjaGenerator *this)

{
  cmGeneratedFileStream *pcVar1;
  bool bVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,NINJA_BUILD_FILE,&local_39)
  ;
  bVar2 = OpenFileStream(this,&this->BuildFileStream,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar1 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar1,"# This file contains all the build statements describing the\n",
               0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar1,"# compilation DAG.\n\n",0x14);
  }
  return bVar2;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}